

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

void bn_reverse(uchar *s,int len)

{
  uchar uVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (long)len;
  for (lVar3 = 0; lVar2 = lVar2 + -1, lVar3 < lVar2; lVar3 = lVar3 + 1) {
    uVar1 = s[lVar3];
    s[lVar3] = s[lVar2];
    s[lVar2] = uVar1;
  }
  return;
}

Assistant:

void bn_reverse (unsigned char *s, int len)
{
  int     ix, iy;
  unsigned char t;

  ix = 0;
  iy = len - 1;
  while (ix < iy) {
    t     = s[ix];
    s[ix] = s[iy];
    s[iy] = t;
    ++ix;
    --iy;
  }
}